

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_uint32_iterator_advance(roaring_uint32_iterator_t *it)

{
  _Bool _Var1;
  uint16_t low16;
  ushort local_a;
  
  if (it->container_index < (it->parent->high_low_container).size) {
    if (it->container_index < 0) {
      it->container_index = 0;
    }
    else {
      local_a = (ushort)it->current_value;
      _Var1 = container_iterator_next(it->container,it->typecode,&it->container_it,&local_a);
      if (_Var1) {
        it->current_value = (uint)local_a | it->highbits;
        it->has_value = true;
        return true;
      }
      it->container_index = it->container_index + 1;
    }
    _Var1 = loadfirstvalue(it);
    it->has_value = _Var1;
  }
  else {
    it->has_value = false;
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool roaring_uint32_iterator_advance(roaring_uint32_iterator_t *it) {
    if (it->container_index >= it->parent->high_low_container.size) {
        return (it->has_value = false);
    }
    if (it->container_index < 0) {
        it->container_index = 0;
        return (it->has_value = loadfirstvalue(it));
    }
    uint16_t low16 = (uint16_t)it->current_value;
    if (container_iterator_next(it->container, it->typecode, &it->container_it,
                                &low16)) {
        it->current_value = it->highbits | low16;
        return (it->has_value = true);
    }
    it->container_index++;
    return (it->has_value = loadfirstvalue(it));
}